

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall zmq::object_t::send_own(object_t *this,own_t *destination_,own_t *object_)

{
  command_t cmd;
  command_t *in_stack_ffffffffffffff00;
  object_t *in_stack_ffffffffffffff08;
  
  own_t::inc_seqnum((own_t *)0x1e94d1);
  send_command(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  return;
}

Assistant:

void zmq::object_t::send_own (own_t *destination_, own_t *object_)
{
    destination_->inc_seqnum ();
    command_t cmd;
    cmd.destination = destination_;
    cmd.type = command_t::own;
    cmd.args.own.object = object_;
    send_command (cmd);
}